

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_global(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  uint self;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  CVmObjPageEntry *pCVar6;
  anon_union_8_8_cb74652f_for_val aVar7;
  vm_datatype_t *pvVar8;
  vm_val_t *pvVar9;
  int iVar10;
  vm_bif_desc *pvVar11;
  CTcSymObjBase *this_00;
  undefined *puVar12;
  vm_val_t *pvVar13;
  CVmMetaclass *pCVar14;
  size_t sVar15;
  tc_metaclass_t meta;
  ulong uVar16;
  vm_val_t symval;
  CVmFuncPtr fp;
  vm_val_t symstr;
  
  if (this->globals_ == 0) {
    return &((CTcSymObjBase *)0x0)->super_CTcSymbol;
  }
  this_00 = (CTcSymObjBase *)0x0;
  symstr.val.obj = CVmObjString::create(0,sym,len);
  pvVar13 = sp_;
  symstr.typ = VM_OBJ;
  aVar7._4_4_ = symstr.val._4_4_;
  aVar7.obj = symstr.val.obj;
  pvVar9 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(symstr._4_4_,5);
  sp_ = pvVar9;
  pvVar13->val = aVar7;
  self = this->globals_;
  pvVar13 = &symval;
  CVmObject::index_val_ov
            ((CVmObject *)
             ((long)&G_obj_table_X.pages_[self >> 0xc]->ptr_ + (ulong)((self & 0xfff) * 0x18)),
             pvVar13,self,&symstr);
  pvVar9 = sp_;
  pvVar8 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar8 = symval.typ;
  *(undefined4 *)&pvVar9->field_0x4 = symval._4_4_;
  (pvVar9->val).obj = symval.val.obj;
  *(undefined4 *)((long)&pvVar9->val + 4) = symval.val._4_4_;
  switch(symval.typ) {
  case VM_OBJ:
    pCVar14 = CVmObjClass::metaclass_reg_;
    iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                    [(ulong)symval.val.obj & 0xfff].ptr_ + 8))();
    uVar16 = (ulong)symval.val.obj;
    pCVar6 = G_obj_table_X.pages_[symval.val.obj >> 0xc];
    if (iVar10 == 0) {
      meta = TC_META_TADSOBJ;
      sVar15 = 0;
      iVar10 = (**(code **)(*(long *)&pCVar6[uVar16 & 0xfff].ptr_ + 0x70))();
      if (iVar10 == 0) {
        pCVar14 = CVmObjTads::metaclass_reg_;
        iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                        [symval.val.obj & 0xfff].ptr_ + 8))();
        if (iVar10 == 0) {
          pCVar14 = CVmObjGramProd::metaclass_reg_;
          iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                          [symval.val.obj & 0xfff].ptr_ + 8))();
          meta = TC_META_GRAMPROD;
          if (iVar10 == 0) {
            pCVar14 = CVmObjDict::metaclass_reg_;
            iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                            [symval.val.obj & 0xfff].ptr_ + 8))();
            meta = TC_META_DICT;
            if (iVar10 == 0) {
              pCVar14 = CVmObjIntClsMod::metaclass_reg_;
              iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                              [symval.val.obj & 0xfff].ptr_ + 8))();
              meta = -(uint)(iVar10 == 0) | TC_META_ICMOD;
            }
          }
        }
        this_00 = (CTcSymObjBase *)
                  CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)pCVar14);
        CTcSymObjBase::CTcSymObjBase
                  (this_00,sym,len,0,(ulong)symval.val.obj,0,meta,(CTcDictEntry *)0x0);
        puVar12 = &CTcSymObj::vtable;
      }
      else {
        this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,sVar15);
        CTcSymObjBase::CTcSymObjBase
                  (this_00,sym,len,0,(ulong)symval.val.obj,0,TC_META_UNKNOWN,(CTcDictEntry *)0x0);
        puVar12 = &CTcSymFuncObj::vtable;
      }
      goto LAB_002818ff;
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)pCVar14);
    uVar3 = **(undefined4 **)((long)&pCVar6[uVar16 & 0xfff].ptr_ + 8);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 = 9;
    *(undefined4 *)&this_00->stream_ofs_ = uVar3;
    *(undefined4 *)&this_00->mod_base_sym_ = 0;
    this_00->obj_stm_ = (CTPNStmObject *)0x0;
    this_00->fixups_ = (CTcIdFixup *)0x0;
    *(vm_obj_id_t *)((long)&this_00->mod_base_sym_ + 4) = symval.val.obj;
    this_00->first_del_prop_ = (CTcObjPropDel *)0x0;
    this_00->obj_id_ = 0;
    *(byte *)&this_00->modifying_obj_ = *(byte *)&this_00->modifying_obj_ & 0xfc;
    puVar12 = &CTcSymMetaclass::vtable;
    break;
  case VM_PROP:
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)pvVar13);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 = 3;
    *(vm_prop_id_t *)&this_00->obj_id_ = symval.val.prop;
    pbVar1 = (byte *)((long)&this_00->obj_id_ + 2);
    *pbVar1 = *pbVar1 & 0xf8;
    puVar12 = &CTcSymProp::vtable;
    goto LAB_002818ff;
  default:
    goto switchD_00281744_caseD_7;
  case VM_FUNCPTR:
    sVar15 = (size_t)symval.val.obj;
    CVmFuncPtr::CVmFuncPtr(&fp,symval.val.ofs);
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,sVar15);
    CTcSymFuncBase::CTcSymFuncBase
              ((CTcSymFuncBase *)this_00,sym,len,0,*fp.p_ & 0x7f,(uint)fp.p_[1],(uint)(*fp.p_ >> 7),
               1,0,0,0,1);
    (((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
    super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
         (_func_int **)&PTR__CTcSymFuncBase_003633b8;
    *(undefined1 *)&this_00->metaclass_ = (char)this_00->metaclass_ & 0xfe;
    this_00->meta_extra_ = (void *)0x0;
    CTcSymFunc::set_abs_addr((CTcSymFunc *)this_00,symval.val.enumval);
    goto switchD_00281744_caseD_7;
  case VM_ENUM:
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)pvVar13);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 = 10;
    this_00->obj_id_ = (ulong)(ulong)symval.val.obj;
    *(byte *)&this_00->stream_ofs_ = *(byte *)&this_00->stream_ofs_ & 0xfc;
    puVar12 = &CTcSymEnum::vtable;
LAB_002818ff:
    (((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
    super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)(puVar12 + 0x10);
    goto switchD_00281744_caseD_7;
  case VM_BIFPTR:
    sVar15 = (size_t)symval.val.prop;
    pvVar11 = CVmBifTable::get_desc
                        (G_bif_table_X,symval.val.obj & 0xffff,(uint)symval.val.bifptr.func_idx);
    if ((pvVar11 == (vm_bif_desc *)0x0) || (pvVar11->func == (_func_void_uint *)0x0)) {
      this_00 = (CTcSymObjBase *)0x0;
      goto switchD_00281744_caseD_7;
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,sVar15);
    iVar10 = pvVar11->min_argc;
    iVar4 = pvVar11->opt_argc;
    iVar5 = pvVar11->varargs;
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 = 6;
    *(vm_prop_id_t *)&this_00->obj_id_ = symval.val.prop;
    *(unsigned_short *)((long)&this_00->obj_id_ + 2) = symval.val.bifptr.func_idx;
    bVar2 = *(byte *)((long)&this_00->stream_ofs_ + 4);
    *(int *)((long)&this_00->obj_id_ + 4) = iVar10;
    *(int *)&this_00->stream_ofs_ = iVar4 + iVar10;
    *(byte *)((long)&this_00->stream_ofs_ + 4) = bVar2 & 0xfe | 2 | (byte)iVar5 & 1;
    puVar12 = &CTcSymBif::vtable;
  }
  (((CTcSymFuncBase *)&this_00->super_CTcSymbol)->super_CTcSymbol).super_CTcSymbolBase.
  super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)(puVar12 + 0x10);
switchD_00281744_caseD_7:
  sp_ = sp_ + -2;
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *find_global(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (globals_ == VM_INVALID_OBJ)
            return 0;

        /* presume we won't find a symbol */
        CTcSymbol *ret = 0;
        
        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ globals_)->index_val_ov(vmg_ &symval, globals_, &symstr);
        G_stk->push(&symval);

        /* check what we found */
        switch (symval.typ)
        {
        case VM_OBJ:
            /* it's an object - map it to CTcSymObj or CTcSymMetaclass */
            if (CVmObjClass::is_intcls_obj(vmg_ symval.val.obj))
            {
                /* 
                 *   it's an IntrinsicClass object - this represents a
                 *   metaclass, so map it to a CTcSymMetaclass symbol 
                 */
                CVmObjClass *cl = (CVmObjClass *)vm_objp(vmg_ symval.val.obj);
                ret = new CTcSymMetaclass(sym, len, FALSE,
                                          cl->get_meta_idx(),
                                          symval.val.obj);
            }
            else if (vm_objp(vmg_ symval.val.obj)->get_invoker(vmg_ 0))
            {
                /* 
                 *   it's an invokable object - create a function-like object
                 *   symbol for it 
                 */
                ret = new CTcSymFuncObj(sym, len, FALSE, symval.val.obj,
                                        FALSE, TC_META_UNKNOWN, 0);
            }
            else
            {
                /* 
                 *   It's not an IntrinsicClass object, so it's a regular
                 *   CTcSymObj symbol.  Check for special metaclasses that
                 *   the compiler is aware of.  
                 */
                tc_metaclass_t meta = TC_META_UNKNOWN;

                if (CVmObjTads::is_tadsobj_obj(vmg_ symval.val.obj))
                    meta = TC_META_TADSOBJ;
                else if (CVmObjGramProd::is_gramprod_obj(vmg_ symval.val.obj))
                    meta = TC_META_GRAMPROD;
                else if (CVmObjDict::is_dictionary_obj(vmg_ symval.val.obj))
                    meta = TC_META_DICT;
                else if (CVmObjIntClsMod::is_intcls_mod_obj(vmg_ symval.val.obj))
                    meta = TC_META_ICMOD;

                /* create the object symbol */
                ret = new CTcSymObj(sym, len, FALSE, symval.val.obj,
                                    FALSE, meta, 0);
            }